

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O1

bool libwebm::vttdemux::WriteChaptersCuePayload(FILE *f,Display *display)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  string line;
  ChapterAtomParser parser;
  string local_70;
  ChapterAtomParser local_50;
  
  ChapterAtomParser::ChapterAtomParser(&local_50,display);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  iVar3 = 0;
  do {
    iVar1 = libwebvtt::LineReader::GetLine(&local_50.super_LineReader,&local_70);
    if (iVar1 < 0) {
      bVar4 = false;
      bVar2 = 0;
    }
    else if (local_70._M_string_length == 0) {
      bVar2 = 1;
      bVar4 = false;
    }
    else {
      bVar2 = 0;
      iVar1 = fprintf((FILE *)f,"%s\n",local_70._M_dataplus._M_p);
      bVar4 = -1 < iVar1;
      iVar3 = iVar3 + (uint)bVar4;
    }
  } while (bVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  libwebvtt::Parser::~Parser((Parser *)&local_50);
  return (bool)(bVar2 & 0 < iVar3);
}

Assistant:

bool vttdemux::WriteChaptersCuePayload(
    FILE* f, const mkvparser::Chapters::Display* display) {
  // Bind a Chapter parser object to the display, which allows us to
  // extract each line of text from the title-part of the display.
  ChapterAtomParser parser(display);

  int count = 0;  // count of lines of payload text written to output file
  for (string line;;) {
    const int e = parser.GetLine(&line);

    if (e < 0)  // error (only -- we allow EOS here)
      return false;

    if (line.empty())  // TODO(matthewjheaney): retain this check?
      break;

    if (fprintf(f, "%s\n", line.c_str()) < 0)
      return false;

    ++count;
  }

  if (count <= 0)  // WebVTT cue requires non-empty payload
    return false;

  return true;
}